

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partmap.hh
# Opt level: O3

vector<TrackedContext,_std::allocator<TrackedContext>_> * __thiscall
partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>::split
          (partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_> *this,
          Address *pnt)

{
  bool bVar1;
  long lVar2;
  mapped_type *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *__x;
  
  p_Var4 = &(this->database)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var3 = (this->database)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[!bVar1]) {
    bVar1 = std::less<Address>::operator()((less<Address> *)this,pnt,(Address *)(p_Var3 + 1));
    if (bVar1) {
      p_Var4 = p_Var3;
    }
  }
  if (p_Var4 == (this->database)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    this_00 = std::
              map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
              ::operator[](&this->database,pnt);
    __x = &this->defaultvalue;
  }
  else {
    lVar2 = std::_Rb_tree_decrement(p_Var4);
    if ((*(AddrSpace **)(lVar2 + 0x20) == pnt->base) && (*(uintb *)(lVar2 + 0x28) == pnt->offset)) {
      return (vector<TrackedContext,_std::allocator<TrackedContext>_> *)(lVar2 + 0x30);
    }
    this_00 = std::
              map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
              ::operator[](&this->database,pnt);
    __x = (vector<TrackedContext,_std::allocator<TrackedContext>_> *)(lVar2 + 0x30);
  }
  std::vector<TrackedContext,_std::allocator<TrackedContext>_>::operator=(this_00,__x);
  return this_00;
}

Assistant:

_valuetype &partmap<_linetype,_valuetype>::
  split(const _linetype &pnt)

  {
    iterator iter;
    
    iter = database.upper_bound(pnt);
    if (iter != database.begin()) {
      --iter;
      if ((*iter).first == pnt)	// point matches exactly
	return (*iter).second;	// Return old ref
      _valuetype &newref( database[pnt] ); // Create new ref at point
      newref = (*iter).second;	// Copy of original partition value
      return newref;
    }
    _valuetype &newref( database[pnt] ); // Create new ref at point
    newref = defaultvalue;	// Copy of defaultvalue
    return newref;
  }